

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O3

shared_ptr<kratos::InterfaceRef> __thiscall
kratos::Generator::interface
          (Generator *this,shared_ptr<kratos::IDefinition> *def,string *interface_name,bool is_port)

{
  _Rb_tree_node_base *__args_2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  __args_3;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
  *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_01;
  __shared_ptr<kratos::InterfaceVar,(__gnu_cxx::_Lock_policy)2> *this_02;
  long *plVar1;
  string *__args;
  bool bVar2;
  iterator iVar3;
  iterator iVar4;
  _Rb_tree_node_base *p_Var5;
  VarException *this_03;
  mapped_type *pmVar6;
  UserException *pUVar7;
  undefined7 in_register_00000009;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  __k;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_R8D;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  __args_3_00;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Port_*>,_false,_true>,_bool>
  pVar8;
  shared_ptr<kratos::InterfaceRef> sVar9;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  string_view format_str_02;
  string_view format_str_03;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  initializer_list<const_kratos::IRNode_*> __l;
  undefined1 local_138 [8];
  undefined1 auStack_130 [40];
  undefined1 local_108 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> var_name_1;
  undefined8 local_e0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_d8;
  uint local_c0 [2];
  undefined1 auStack_b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> var_name;
  shared_ptr<kratos::InterfaceVar> v;
  _Base_ptr p_Stack_80;
  Generator *local_50;
  string *local_48;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *local_40;
  undefined4 local_38;
  bool local_32;
  bool local_31;
  
  __k._1_7_ = in_register_00000009;
  __k._0_1_ = is_port;
  this_00 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
             *)(def + 0x10);
  local_48 = interface_name;
  local_38 = in_R8D;
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
                  *)this_00,(key_type *)__k.values_);
  if (iVar3._M_node !=
      (_Base_ptr)
      &def[0x10].super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
    this_03 = (VarException *)__cxa_allocate_exception(0x10);
    local_138 = (undefined1  [8])((__k.values_)->field_0).long_long_value;
    auStack_130._0_8_ = ((__k.values_)->field_0).string.size;
    auStack_130._8_8_ =
         def[9].super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    auStack_130._16_8_ =
         def[10].super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    format_str_01.size_ = 0xdd;
    format_str_01.data_ = (char *)0x19;
    args_01.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args_01.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_138;
    fmt::v7::detail::vformat_abi_cxx11_
              ((string *)((long)&var_name.field_2 + 8),(detail *)0x239aae,format_str_01,args_01);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
             ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
                   *)this_00,(key_type *)__k.values_);
    local_e0 = (pmVar6->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    __l._M_len = 1;
    __l._M_array = (iterator)&local_e0;
    std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
              ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)local_138,
               __l,(allocator_type *)auStack_b8);
    VarException::VarException
              (this_03,(string *)((long)&var_name.field_2 + 8),
               (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)local_138)
    ;
    __cxa_throw(this_03,&VarException::typeinfo,std::runtime_error::~runtime_error);
  }
  this_01 = &def[0x48].super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>_>_>_>
                  *)this_01,(key_type *)__k.values_);
  if (iVar4._M_node == (_Base_ptr)(def + 0x49)) {
    bVar2 = is_valid_variable_name((string *)__k.values_);
    __args = local_48;
    if (bVar2) {
      (**(code **)(*(long *)(local_48->_M_dataplus)._M_p + 0x28))(local_138);
      (this->super_IRNode)._vptr_IRNode = (_func_int **)0x0;
      local_40 = &(this->super_IRNode).fn_name_ln;
      __args_3_00 = __k;
      var_name.field_2._8_8_ = def;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<kratos::InterfaceRef,std::allocator<kratos::InterfaceRef>,std::shared_ptr<kratos::IDefinition>const&,kratos::Generator*,std::__cxx11::string_const&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_40,(InterfaceRef **)this,
                 (allocator<kratos::InterfaceRef> *)&local_e0,
                 (shared_ptr<kratos::IDefinition> *)__args,
                 (Generator **)((long)&var_name.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k.values_);
      *(char *)((this->super_IRNode)._vptr_IRNode + 0x10) = (char)local_38;
      if ((_Rb_tree_node_base *)auStack_130._16_8_ != (_Rb_tree_node_base *)auStack_130) {
        this_02 = (__shared_ptr<kratos::InterfaceVar,(__gnu_cxx::_Lock_policy)2> *)
                  ((long)&var_name.field_2 + 8);
        p_Var5 = (_Rb_tree_node_base *)auStack_130._16_8_;
        do {
          __args_2 = p_Var5 + 1;
          plVar1 = (long *)(local_48->_M_dataplus)._M_p;
          (**(code **)(*plVar1 + 0x18))(&local_e0,plVar1,__args_2);
          var_name.field_2._8_8_ = ((__k.values_)->field_0).long_long_value;
          v.super___shared_ptr<kratos::InterfaceVar,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)((__k.values_)->field_0).custom.format;
          v.super___shared_ptr<kratos::InterfaceVar,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var5 + 1);
          p_Stack_80 = p_Var5[1]._M_parent;
          format_str.size_ = 0xdd;
          format_str.data_ = (char *)0x7;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.args_ = __args_3_00.args_;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)this_02;
          fmt::v7::detail::vformat_abi_cxx11_
                    ((string *)auStack_b8,(detail *)0x242349,format_str,args);
          local_108 = (undefined1  [8])(this->super_IRNode)._vptr_IRNode;
          local_31 = false;
          __args_3_00.values_ =
               (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)&local_e0;
          local_50 = (Generator *)def;
          std::__shared_ptr<kratos::InterfaceVar,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<std::allocator<kratos::InterfaceVar>,kratos::InterfaceRef*,kratos::Generator*,std::__cxx11::string_const&,unsigned_int_const&,std::vector<unsigned_int,std::allocator<unsigned_int>>const&,bool>
                    (this_02,(allocator<kratos::InterfaceVar> *)((long)&var_name_1.field_2 + 8),
                     (InterfaceRef **)local_108,&local_50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args_2,
                     (uint *)__args_3_00.values_,&local_d8,&local_31);
          local_108 = (undefined1  [8])var_name.field_2._8_8_;
          std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,kratos::Var*>,std::allocator<std::pair<std::__cxx11::string_const,kratos::Var*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::_M_emplace<std::__cxx11::string_const&,kratos::Var*&>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,kratos::Var*>,std::allocator<std::pair<std::__cxx11::string_const,kratos::Var*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)((this->super_IRNode)._vptr_IRNode + 2),__args_2,local_108);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
          ::_M_emplace_unique<std::__cxx11::string&,std::shared_ptr<kratos::InterfaceVar>&>
                    (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             auStack_b8,(shared_ptr<kratos::InterfaceVar> *)this_02);
          if (v.super___shared_ptr<kratos::InterfaceVar,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       v.super___shared_ptr<kratos::InterfaceVar,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      );
          }
          if (auStack_b8 != (undefined1  [8])&var_name._M_string_length) {
            operator_delete((void *)auStack_b8,var_name._M_string_length + 1);
          }
          if (local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_d8.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_d8.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
        } while (p_Var5 != (_Rb_tree_node_base *)auStack_130);
      }
      (**(code **)(*(long *)(local_48->_M_dataplus)._M_p + 0x20))
                ((undefined1 *)((long)&var_name.field_2 + 8));
      if (p_Stack_80 != (_Base_ptr)&v) {
        do {
          __args_3.args_ = (format_arg *)(p_Stack_80 + 1);
          plVar1 = (long *)(local_48->_M_dataplus)._M_p;
          (**(code **)(*plVar1 + 0x10))(&local_e0,plVar1,__args_3.values_);
          auStack_b8 = (undefined1  [8])((__k.values_)->field_0).long_long_value;
          var_name._M_dataplus._M_p = (pointer)((__k.values_)->field_0).string.size;
          var_name._M_string_length = *(size_type *)(p_Stack_80 + 1);
          var_name.field_2._M_allocated_capacity = (size_type)p_Stack_80[1]._M_parent;
          format_str_00.size_ = 0xdd;
          format_str_00.data_ = (char *)0x7;
          args_00.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.args_ = __args_3_00.args_;
          args_00.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)auStack_b8;
          fmt::v7::detail::vformat_abi_cxx11_
                    ((string *)local_108,(detail *)0x242349,format_str_00,args_00);
          local_50 = (Generator *)(this->super_IRNode)._vptr_IRNode;
          local_32 = false;
          __args_3_00.args_ = __args_3.args_;
          var_name_1.field_2._8_8_ = def;
          std::__shared_ptr<kratos::InterfacePort,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<std::allocator<kratos::InterfacePort>,kratos::InterfaceRef*,kratos::Generator*,kratos::PortDirection_const&,std::__cxx11::string_const&,unsigned_int_const&,std::vector<unsigned_int,std::allocator<unsigned_int>>const&,kratos::PortType_const&,bool>
                    ((__shared_ptr<kratos::InterfacePort,(__gnu_cxx::_Lock_policy)2> *)auStack_b8,
                     (allocator<kratos::InterfacePort> *)&local_31,(InterfaceRef **)&local_50,
                     (Generator **)((long)&var_name_1.field_2 + 8),
                     (PortDirection *)((long)&local_e0 + 4),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __args_3.values_,local_c0,&local_d8,(PortType *)&local_e0,&local_32);
          local_50 = (Generator *)auStack_b8;
          pVar8 = std::
                  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,kratos::Port*>,std::allocator<std::pair<std::__cxx11::string_const,kratos::Port*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  ::_M_emplace<std::__cxx11::string_const&,kratos::Port*&>
                            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,kratos::Port*>,std::allocator<std::pair<std::__cxx11::string_const,kratos::Port*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                              *)((this->super_IRNode)._vptr_IRNode + 9),__args_3.values_,&local_50);
          if ((char)local_38 != '\0') {
            (*(code *)(def->super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr[7]._vptr_IDefinition)(def,local_108,pVar8._8_8_);
          }
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
          ::_M_emplace_unique<std::__cxx11::string&,std::shared_ptr<kratos::InterfacePort>&>
                    (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_108,(shared_ptr<kratos::InterfacePort> *)auStack_b8);
          if (var_name._M_dataplus._M_p != (pointer)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)var_name._M_dataplus._M_p);
          }
          if (local_108 != (undefined1  [8])&var_name_1._M_string_length) {
            operator_delete((void *)local_108,var_name_1._M_string_length + 1);
          }
          if (local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_d8.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_d8.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          p_Stack_80 = (_Base_ptr)std::_Rb_tree_increment(p_Stack_80);
        } while (p_Stack_80 != (_Rb_tree_node_base *)&v);
      }
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::InterfaceRef>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::InterfaceRef>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::InterfaceRef>>>>
      ::_M_emplace_unique<std::__cxx11::string_const&,std::shared_ptr<kratos::InterfaceRef>&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::InterfaceRef>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::InterfaceRef>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::InterfaceRef>>>>
                  *)this_01,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k.values_,
                 (shared_ptr<kratos::InterfaceRef> *)this);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&var_name.field_2 + 8));
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_138);
      sVar9.super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           extraout_RDX._M_pi;
      sVar9.super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (shared_ptr<kratos::InterfaceRef>)
             sVar9.super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>;
    }
    pUVar7 = (UserException *)__cxa_allocate_exception(0x10);
    var_name.field_2._8_8_ = ((__k.values_)->field_0).long_long_value;
    v.super___shared_ptr<kratos::InterfaceVar,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)((__k.values_)->field_0).custom.format;
    format_str_03.size_ = 0xd;
    format_str_03.data_ = (char *)0x1e;
    args_03.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args_03.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)((long)&var_name.field_2 + 8);
    fmt::v7::detail::vformat_abi_cxx11_
              ((string *)local_138,(detail *)"{0} is a SystemVerilog keyword",format_str_03,args_03)
    ;
    UserException::UserException(pUVar7,(string *)local_138);
    __cxa_throw(pUVar7,&UserException::typeinfo,std::runtime_error::~runtime_error);
  }
  pUVar7 = (UserException *)__cxa_allocate_exception(0x10);
  local_138 = (undefined1  [8])((__k.values_)->field_0).long_long_value;
  auStack_130._0_8_ = ((__k.values_)->field_0).string.size;
  auStack_130._8_8_ =
       def[9].super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  auStack_130._16_8_ =
       def[10].super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  format_str_02.size_ = 0xdd;
  format_str_02.data_ = (char *)0x19;
  args_02.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ = in_R9.values_;
  args_02.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)local_138;
  fmt::v7::detail::vformat_abi_cxx11_
            ((string *)((long)&var_name.field_2 + 8),(detail *)0x239aae,format_str_02,args_02);
  UserException::UserException(pUVar7,(string *)((long)&var_name.field_2 + 8));
  __cxa_throw(pUVar7,&UserException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::shared_ptr<InterfaceRef> Generator::interface(const std::shared_ptr<IDefinition> &def,
                                                   const std::string &interface_name,
                                                   bool is_port) {
    // making sure that it doesn't have ports or vars
    if (vars_.find(interface_name) != vars_.end()) {
        throw VarException(::format("{0} already exists in {1}", interface_name, instance_name),
                           {vars_.at(interface_name).get()});
    }
    if (interfaces_.find(interface_name) != interfaces_.end()) {
        throw UserException(::format("{0} already exists in {1}", interface_name, instance_name));
    }
    // check to see if it's a valid name
    if (!is_valid_variable_name(interface_name)) {
        throw UserException(::format("{0} is a SystemVerilog keyword", interface_name));
    }
    // create vars
    auto const &vars = def->vars();
    auto ref = std::make_shared<InterfaceRef>(def, this, interface_name);
    ref->is_port() = is_port;
    for (auto const &n : vars) {
        auto const &[width, size] = def->var(n);
        // for now they are all unsigned
        auto var_name = ::format("{0}.{1}", interface_name, n);
        auto v = std::make_shared<InterfaceVar>(ref.get(), this, n, width, size, false);
        ref->var(n, v.get());
        vars_.emplace(var_name, v);
    }
    auto const &ports = def->ports();
    for (auto const &n : ports) {
        auto const &[width, size, dir, type] = def->port(n);
        // for now they are all unsigned
        auto var_name = ::format("{0}.{1}", interface_name, n);
        auto p = std::make_shared<InterfacePort>(ref.get(), this, dir, n, width, size, type, false);
        ref->port(n, p.get());
        if (is_port) add_port_name(var_name);
        vars_.emplace(var_name, p);
    }
    // put it in the interface
    interfaces_.emplace(interface_name, ref);
    return ref;
}